

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O3

_Bool monster_group_change_index(chunk_conflict *c,wchar_t new,wchar_t old)

{
  wchar_t wVar1;
  monster_group *pmVar2;
  _Bool _Var3;
  monster *pmVar4;
  monster_group *pmVar5;
  mon_group_list_entry *pmVar6;
  
  pmVar4 = cave_monster(c,old);
  wVar1 = pmVar4->group_info[0].index;
  pmVar4 = cave_monster(c,old);
  pmVar2 = c->monster_groups[wVar1];
  pmVar5 = c->monster_groups[pmVar4->group_info[1].index];
  pmVar6 = pmVar2->member_list;
  if (pmVar2->leader == old) {
    pmVar2->leader = new;
  }
  for (; pmVar6 != (mon_group_list_entry *)0x0; pmVar6 = pmVar6->next) {
    if ((pmVar6->midx == old) && (pmVar6->midx = new, pmVar5 == (monster_group *)0x0))
    goto LAB_0016802a;
  }
  if (pmVar5 == (monster_group *)0x0) {
LAB_0016802e:
    _Var3 = false;
  }
  else {
    if (pmVar5->leader == old) {
      pmVar5->leader = new;
    }
    do {
      pmVar5 = (monster_group *)pmVar5->member_list;
      if (pmVar5 == (monster_group *)0x0) goto LAB_0016802e;
    } while (pmVar5->index != old);
    pmVar5->index = new;
LAB_0016802a:
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool monster_group_change_index(struct chunk *c, int new, int old)
{
	int index0 = cave_monster(c, old)->group_info[PRIMARY_GROUP].index;
	int index1 = cave_monster(c, old)->group_info[SUMMON_GROUP].index;
	struct monster_group *group0 = monster_group_by_index(c, index0);
	struct monster_group *group1 = monster_group_by_index(c, index1);
	struct mon_group_list_entry *entry = group0->member_list;

	if (group0->leader == old) {
		group0->leader = new;
	}
	while (entry) {
		if (entry->midx == old) {
			entry->midx = new;
			if (!group1) {
				return true;
			}
		}
		entry = entry->next;
	}

	if (group1) {
		if (group1->leader == old) {
			group1->leader = new;
		}
		entry = group1->member_list;
		while (entry) {
			if (entry->midx == old) {
				entry->midx = new;
				return true;
			}
			entry = entry->next;
		}
	}

	return false;
}